

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O1

int uv__iou_fs_read_or_write(uv_loop_t *loop,uv_fs_t *req,int is_read)

{
  uv__io_uring_sqe *puVar1;
  uint64_t uVar2;
  uv__iou *iou;
  
  if (0x400 < req->nbufs) {
    if (is_read == 0) {
      return 0;
    }
    req->nbufs = 0x400;
  }
  iou = (uv__iou *)((long)loop->internal_fields + 0x150);
  puVar1 = uv__iou_get_sqe(iou,loop,req);
  if (puVar1 == (uv__io_uring_sqe *)0x0) {
    return 0;
  }
  puVar1->field_5 = (anon_union_8_1_898948ef_for_uv__io_uring_sqe_6)req->bufs;
  puVar1->fd = req->file;
  puVar1->len = req->nbufs;
  uVar2 = 0xffffffffffffffff;
  if (-1 < req->off) {
    uVar2 = req->off;
  }
  (puVar1->field_4).off = uVar2;
  puVar1->opcode = (is_read == 0) + '\x01';
  uv__iou_submit(iou);
  return 1;
}

Assistant:

int uv__iou_fs_read_or_write(uv_loop_t* loop,
                             uv_fs_t* req,
                             int is_read) {
  struct uv__io_uring_sqe* sqe;
  struct uv__iou* iou;

  /* If iovcnt is greater than IOV_MAX, cap it to IOV_MAX on reads and fallback
   * to the threadpool on writes */
  if (req->nbufs > IOV_MAX) {
    if (is_read)
      req->nbufs = IOV_MAX;
    else
      return 0;
  }

  iou = &uv__get_internal_fields(loop)->iou;

  sqe = uv__iou_get_sqe(iou, loop, req);
  if (sqe == NULL)
    return 0;

  sqe->addr = (uintptr_t) req->bufs;
  sqe->fd = req->file;
  sqe->len = req->nbufs;
  sqe->off = req->off < 0 ? -1 : req->off;
  sqe->opcode = is_read ? UV__IORING_OP_READV : UV__IORING_OP_WRITEV;

  uv__iou_submit(iou);

  return 1;
}